

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_psbt.cpp
# Opt level: O0

Psbt * __thiscall cfd::Psbt::operator=(Psbt *this,Psbt *psbt)

{
  undefined8 uVar1;
  Psbt *in_RSI;
  Psbt *in_RDI;
  int ret;
  wally_psbt *psbt_src_pointer;
  wally_psbt *psbt_pointer;
  Transaction *__return_storage_ptr__;
  Transaction *in_stack_ffffffffffffff30;
  CfdError in_stack_ffffffffffffff4c;
  CfdException *in_stack_ffffffffffffff50;
  allocator local_61;
  string local_60 [32];
  CfdSourceLocation local_40;
  int local_24;
  wally_psbt *local_20;
  wally_psbt *local_18 [3];
  
  if (in_RDI != in_RSI) {
    local_18[0] = (wally_psbt *)0x0;
    local_20 = (wally_psbt *)(in_RSI->super_Psbt).wally_psbt_pointer_;
    local_24 = wally_psbt_clone_alloc(local_20,0,local_18);
    if (local_24 != 0) {
      local_40.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/src/cfd_psbt.cpp"
                   ,0x2f);
      local_40.filename = local_40.filename + 1;
      local_40.line = 0xd9;
      local_40.funcname = "operator=";
      core::logger::warn<int&>(&local_40,"wally_psbt_clone_alloc NG[{}]",&local_24);
      uVar1 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_60,"psbt clone error.",&local_61);
      core::CfdException::CfdException
                (in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,(string *)in_RDI);
      __cxa_throw(uVar1,&core::CfdException::typeinfo,core::CfdException::~CfdException);
    }
    core::Psbt::FreeWallyPsbtAddress((in_RDI->super_Psbt).wally_psbt_pointer_);
    (in_RDI->super_Psbt).wally_psbt_pointer_ = local_18[0];
    __return_storage_ptr__ = (Transaction *)&stack0xffffffffffffff48;
    core::Psbt::RebuildTransaction(__return_storage_ptr__,(in_RDI->super_Psbt).wally_psbt_pointer_);
    core::Transaction::operator=(&(in_RDI->super_Psbt).base_tx_,__return_storage_ptr__);
    core::Transaction::~Transaction(in_stack_ffffffffffffff30);
    std::
    set<cfd::core::OutPoint,_std::less<cfd::core::OutPoint>,_std::allocator<cfd::core::OutPoint>_>::
    operator=((set<cfd::core::OutPoint,_std::less<cfd::core::OutPoint>,_std::allocator<cfd::core::OutPoint>_>
               *)in_stack_ffffffffffffff30,
              (set<cfd::core::OutPoint,_std::less<cfd::core::OutPoint>,_std::allocator<cfd::core::OutPoint>_>
               *)__return_storage_ptr__);
  }
  return in_RDI;
}

Assistant:

Psbt& Psbt::operator=(const Psbt& psbt) & {
  if (this != &psbt) {
    struct wally_psbt* psbt_pointer = nullptr;
    struct wally_psbt* psbt_src_pointer = nullptr;
    psbt_src_pointer =
        static_cast<struct wally_psbt*>(psbt.wally_psbt_pointer_);
    int ret = wally_psbt_clone_alloc(psbt_src_pointer, 0, &psbt_pointer);
    if (ret != WALLY_OK) {
      warn(CFD_LOG_SOURCE, "wally_psbt_clone_alloc NG[{}]", ret);
      throw CfdException(CfdError::kCfdInternalError, "psbt clone error.");
    }
    cfd::core::Psbt::FreeWallyPsbtAddress(wally_psbt_pointer_);  // free
    wally_psbt_pointer_ = psbt_pointer;
    base_tx_ = cfd::core::Psbt::RebuildTransaction(wally_psbt_pointer_);
    verify_ignore_map_ = psbt.verify_ignore_map_;
  }
  return *this;
}